

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiletime_manipulation.cpp
# Opt level: O1

int main(void)

{
  ostream *poVar1;
  ct_binary_expr<_36ba204c_> cStack_48;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Evaluate (1-x-y)xy at (1,2,5):",0x1e);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  std::ostream::flush();
  poVar1 = std::ostream::_M_insert<double>(-4.0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Replace ( (1-x-y)xy, x) and evaluate at (1,2,5):",0x30);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  std::ostream::flush();
  poVar1 = viennamath::operator<<
                     ((ostream *)&std::cout,
                      (ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<2UL>_>,_viennamath::op_minus<double>,_viennamath::ct_variable<1UL>_>,_viennamath::op_mult<double>,_viennamath::ct_variable<2UL>_>,_viennamath::op_mult<double>,_viennamath::ct_variable<1UL>_>
                       *)&cStack_48);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  poVar1 = std::ostream::_M_insert<double>(-60.0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "Differentiate (1-x-y)xy with respect to x and evaluate the result at (1,2,5):",0x4d);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  std::ostream::flush();
  poVar1 = viennamath::operator<<
                     ((ostream *)&std::cout,
                      (ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<0L>,_viennamath::op_minus<double>,_viennamath::ct_constant<1L>_>,_viennamath::op_minus<double>,_viennamath::ct_constant<0L>_>,_viennamath::op_mult<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_plus<double>,_viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_minus<double>,_viennamath::ct_variable<1UL>_>,_viennamath::op_mult<double>,_viennamath::ct_constant<1L>_>_>,_viennamath::op_mult<double>,_viennamath::ct_variable<1UL>_>,_viennamath::op_plus<double>,_viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_minus<double>,_viennamath::ct_variable<1UL>_>,_viennamath::op_mult<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_mult<double>,_viennamath::ct_constant<0L>_>_>
                       *)&cStack_48);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  poVar1 = std::ostream::_M_insert<double>(-6.0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Evaluation test of super-complicated expression:",0x30);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  std::ostream::flush();
  poVar1 = std::ostream::_M_insert<double>(-1.0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Expanding (1-x)*(1-y)*(1-z):",0x1c);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  std::ostream::flush();
  poVar1 = viennamath::operator<<((ostream *)&std::cout,&cStack_48);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  poVar1 = std::ostream::_M_insert<double>(0.0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  poVar1 = std::ostream::_M_insert<double>(0.0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Extracting coefficients from (1-x)*(1-y)*(1-z):",0x2f);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"x: ",3);
  poVar1 = viennamath::operator<<
                     ((ostream *)&std::cout,
                      (ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<0L>,_viennamath::op_minus<double>,_viennamath::ct_constant<0L>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_constant<0L>,_viennamath::op_minus<double>,_viennamath::ct_constant<0L>_>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_mult<double>,_viennamath::ct_constant<1L>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_variable<2UL>,_viennamath::op_mult<double>,_viennamath::ct_constant<1L>_>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_mult<double>,_viennamath::ct_variable<1UL>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_variable<2UL>,_viennamath::op_mult<double>,_viennamath::ct_variable<1UL>_>_>_>_>
                       *)&cStack_48);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"y: ",3);
  poVar1 = viennamath::operator<<
                     ((ostream *)&std::cout,
                      (ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<0L>,_viennamath::op_minus<double>,_viennamath::ct_constant<0L>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_mult<double>,_viennamath::ct_constant<1L>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_variable<2UL>,_viennamath::op_mult<double>,_viennamath::ct_constant<1L>_>_>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<0L>,_viennamath::op_minus<double>,_viennamath::ct_constant<0L>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_mult<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_variable<2UL>,_viennamath::op_mult<double>,_viennamath::ct_variable<0UL>_>_>_>_>
                       *)&cStack_48);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"z: ",3);
  poVar1 = viennamath::operator<<
                     ((ostream *)&std::cout,
                      (ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<0L>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_mult<double>,_viennamath::ct_constant<1L>_>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_constant<0L>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_variable<1UL>,_viennamath::op_mult<double>,_viennamath::ct_constant<1L>_>_>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<0L>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_mult<double>,_viennamath::ct_variable<0UL>_>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_constant<0L>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_variable<1UL>,_viennamath::op_mult<double>,_viennamath::ct_variable<0UL>_>_>_>_>
                       *)&cStack_48);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Dropping coefficients from (1-x)*(1-y)*(1-z):",0x2d);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Drop x-terms: ",0xe);
  poVar1 = viennamath::operator<<
                     ((ostream *)&std::cout,
                      (ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<2UL>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_variable<1UL>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_variable<2UL>,_viennamath::op_mult<double>,_viennamath::ct_variable<1UL>_>_>_>
                       *)&cStack_48);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Drop y-terms: ",0xe);
  poVar1 = viennamath::operator<<
                     ((ostream *)&std::cout,
                      (ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<2UL>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_variable<2UL>,_viennamath::op_mult<double>,_viennamath::ct_variable<0UL>_>_>_>
                       *)&cStack_48);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Drop z-terms: ",0xe);
  poVar1 = viennamath::operator<<
                     ((ostream *)&std::cout,
                      (ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<1UL>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_variable<1UL>,_viennamath::op_mult<double>,_viennamath::ct_variable<0UL>_>_>_>
                       *)&cStack_48);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Integrate x*y:",0xe);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"with respect to x on [0,1]: ",0x1c);
  poVar1 = viennamath::operator<<
                     ((ostream *)&std::cout,
                      (ct_binary_expr<viennamath::ct_variable<1UL>,_viennamath::op_div<double>,_viennamath::ct_constant<2L>_>
                       *)&cStack_48);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"with respect to y on [0,1]: ",0x1c);
  poVar1 = viennamath::operator<<
                     ((ostream *)&std::cout,
                      (ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_div<double>,_viennamath::ct_constant<2L>_>
                       *)&cStack_48);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Integrate (1-x)*(1-y)*x*y: ",0x1b);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"with respect to x on [0,1]: ",0x1c);
  poVar1 = viennamath::operator<<
                     ((ostream *)&std::cout,
                      (ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<1UL>,_viennamath::op_div<double>,_viennamath::ct_constant<2L>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<1UL>,_viennamath::op_mult<double>,_viennamath::ct_variable<1UL>_>,_viennamath::op_div<double>,_viennamath::ct_constant<2L>_>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<1UL>,_viennamath::op_div<double>,_viennamath::ct_constant<3L>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<1UL>,_viennamath::op_mult<double>,_viennamath::ct_variable<1UL>_>,_viennamath::op_div<double>,_viennamath::ct_constant<3L>_>_>_>
                       *)&cStack_48);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"with respect to y on [0,1]: ",0x1c);
  poVar1 = viennamath::operator<<
                     ((ostream *)&std::cout,
                      (ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_div<double>,_viennamath::ct_constant<2L>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_div<double>,_viennamath::ct_constant<3L>_>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_mult<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_div<double>,_viennamath::ct_constant<2L>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_mult<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_div<double>,_viennamath::ct_constant<3L>_>_>_>
                       *)&cStack_48);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Integration on unit triangle:",0x1d);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"1: ",3);
  poVar1 = viennamath::operator<<
                     ((ostream *)&std::cout,
                      (ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_div<double>,_viennamath::ct_constant<2L>_>
                       *)&cStack_48);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"x: ",3);
  poVar1 = viennamath::operator<<
                     ((ostream *)&std::cout,
                      (ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_div<double>,_viennamath::ct_constant<6L>_>
                       *)&cStack_48);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"y: ",3);
  poVar1 = viennamath::operator<<
                     ((ostream *)&std::cout,
                      (ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_div<double>,_viennamath::ct_constant<6L>_>
                       *)&cStack_48);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"1-x-y: ",7);
  poVar1 = viennamath::operator<<
                     ((ostream *)&std::cout,
                      (ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_div<double>,_viennamath::ct_constant<6L>_>
                       *)&cStack_48);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"x^2: ",5);
  poVar1 = viennamath::operator<<
                     ((ostream *)&std::cout,
                      (ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_div<double>,_viennamath::ct_constant<12L>_>
                       *)&cStack_48);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"y^2: ",5);
  poVar1 = viennamath::operator<<
                     ((ostream *)&std::cout,
                      (ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_div<double>,_viennamath::ct_constant<12L>_>
                       *)&cStack_48);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"(1-x-y)^2: ",0xb);
  poVar1 = viennamath::operator<<
                     ((ostream *)&std::cout,
                      (ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_div<double>,_viennamath::ct_constant<12L>_>
                       *)&cStack_48);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"x*y: ",5);
  poVar1 = viennamath::operator<<
                     ((ostream *)&std::cout,
                      (ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_div<double>,_viennamath::ct_constant<24L>_>
                       *)&cStack_48);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"x*(1-x-y): ",0xb);
  poVar1 = viennamath::operator<<
                     ((ostream *)&std::cout,
                      (ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_div<double>,_viennamath::ct_constant<24L>_>
                       *)&cStack_48);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"y*(1-x-y): ",0xb);
  poVar1 = viennamath::operator<<
                     ((ostream *)&std::cout,
                      (ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_div<double>,_viennamath::ct_constant<24L>_>
                       *)&cStack_48);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"************************************************",0x30);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"*****     TEST COMPLETED SUCCESSFULLY!     *****",0x30);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"************************************************",0x30);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  std::ostream::flush();
  return 0;
}

Assistant:

int main()
{
  viennamath::ct_constant<0> c0;
  viennamath::ct_constant<1> c1;
  viennamath::ct_constant<2> c2;
  viennamath::ct_constant<5> c5;
  viennamath::ct_constant<7> c7;

  viennamath::ct_variable<0> x;
  viennamath::ct_variable<1> y;
  viennamath::ct_variable<2> z;

  std::cout << "Evaluate (1-x-y)xy at (1,2,5):" << std::endl;
  std::cout << viennamath::eval( (c1 - x - y) * x * y, viennamath::make_vector(c1, c2, c5) ) << std::endl;

  std::cout << "Replace ( (1-x-y)xy, x) and evaluate at (1,2,5):" << std::endl;
  std::cout << viennamath::substitute(x, z, (c1 - x - y) * x * y) << std::endl;
  std::cout << viennamath::eval(
                  viennamath::substitute(x, z, (c1 - x - y) * x * y),
                  viennamath::make_vector(c1, c2, c5)
               ) << std::endl;

  std::cout << "Differentiate (1-x-y)xy with respect to x and evaluate the result at (1,2,5):" << std::endl;
  std::cout << viennamath::diff((c1 - x - y) * x * y, x) << std::endl;
  /*std::cout << viennamath::ct_eval(
                  viennamath::diff((c1 - x - y) * x * y, x),
                  viennamath::make_vector(c1, c2, c5)
               ) << std::endl;*/
  std::cout << viennamath::eval(
                  viennamath::diff((c1 - x - y) * x * y, x),
                  viennamath::make_vector(c1, c2, c5)
               ) << std::endl;

  std::cout << "Evaluation test of super-complicated expression:" << std::endl;
  /*std::cout << viennamath::ct_eval(
                viennamath::diff((c1 - x - y/x) * x * y / (c2 - y / (x + y)) * (x + y) / (z+x), x) - c1 / (c2  + c2),
                viennamath::make_vector(c1, c2, c5)
              ) << std::endl;*/
  std::cout << viennamath::eval(
                viennamath::diff((c1 - x - y/x) * x * y / (c2 - y / (x + y)) * (x + y) / (z+x), x) - c1 / (c2  + c2),
                viennamath::make_vector(c1, c2, c5)
              ) << std::endl;


  std::cout << "Expanding (1-x)*(1-y)*(1-z):" << std::endl;
  std::cout << viennamath::expand( (c1 - x) * (c1 - y) * (c1 - z) ) << std::endl;
  std::cout << viennamath::eval(
                (c1 - x) * (c1 - y) * (c1 - z),
                viennamath::make_vector(c1, c2, c5)
              ) << std::endl;
  std::cout << viennamath::eval(
                viennamath::expand( (c1 - x) * (c1 - y) * (c1 - z) ),
                viennamath::make_vector(c1, c2, c5)
              ) << std::endl;


  std::cout << "Extracting coefficients from (1-x)*(1-y)*(1-z):" << std::endl;
  std::cout << "x: " << viennamath::coefficient(x, (c1 - x) * (c1 - y) * (c1 - z) ) << std::endl;
  std::cout << "y: " << viennamath::coefficient(y, (c1 - x) * (c1 - y) * (c1 - z) ) << std::endl;
  std::cout << "z: " << viennamath::coefficient(z, (c1 - x) * (c1 - y) * (c1 - z) ) << std::endl;

  std::cout << "Dropping coefficients from (1-x)*(1-y)*(1-z):" << std::endl;
  std::cout << "Drop x-terms: " << viennamath::drop_dependent_terms(x, (c1 - x) * (c1 - y) * (c1 - z) ) << std::endl;
  std::cout << "Drop y-terms: " << viennamath::drop_dependent_terms(y, (c1 - x) * (c1 - y) * (c1 - z) ) << std::endl;
  std::cout << "Drop z-terms: " << viennamath::drop_dependent_terms(z, (c1 - x) * (c1 - y) * (c1 - z) ) << std::endl;


  std::cout << "Integrate x*y:" << std::endl;
  std::cout << "with respect to x on [0,1]: " << viennamath::integrate( viennamath::make_interval(c0, c1),
                                                                        x*y,
                                                                        x) << std::endl;
  std::cout << "with respect to y on [0,1]: " << viennamath::integrate( viennamath::make_interval(c0, c1),
                                                                        x*y,
                                                                        y) << std::endl;

  std::cout << "Integrate (1-x)*(1-y)*x*y: " << std::endl;

  std::cout << "with respect to x on [0,1]: " << viennamath::integrate( viennamath::make_interval(c0, c1),
                                                                         (c1-x)*(c1-y)*x*y,
                                                                         x) << std::endl;
  std::cout << "with respect to y on [0,1]: " << viennamath::integrate( viennamath::make_interval(c0, c1),
                                                                         (c1-x)*(c1-y)*x*y,
                                                                         y) << std::endl;


  std::cout << "Integration on unit triangle:" << std::endl;
  std::cout << "1: " << viennamath::integrate( viennamath::make_interval(c0, c1),
                                               viennamath::integrate( viennamath::make_interval(c0, c1 - x),
                                                                      c1,
                                                                      y),
                                               x) << std::endl;
  //linear
  std::cout << "x: " << viennamath::integrate( viennamath::make_interval(c0, c1),
                                               viennamath::integrate( viennamath::make_interval(c0, c1 - x),
                                                                      x,
                                                                      y),
                                               x) << std::endl;
  std::cout << "y: " << viennamath::integrate( viennamath::make_interval(c0, c1),
                                               viennamath::integrate( viennamath::make_interval(c0, c1 - x),
                                                                      y,
                                                                      y),
                                               x) << std::endl;
  std::cout << "1-x-y: " << viennamath::integrate( viennamath::make_interval(c0, c1),
                                                   viennamath::integrate( viennamath::make_interval(c0, c1 - x),
                                                                          c1 - x - y,
                                                                          y),
                                                    x) << std::endl;

  //quadratic:
  std::cout << "x^2: " << viennamath::integrate( viennamath::make_interval(c0, c1),
                                                 viennamath::integrate( viennamath::make_interval(c0, c1 - x),
                                                                        x*x,
                                                                        y),
                                                 x) << std::endl;
  std::cout << "y^2: " << viennamath::integrate( viennamath::make_interval(c0, c1),
                                                 viennamath::integrate( viennamath::make_interval(c0, c1 - x),
                                                                        y*y,
                                                                        y),
                                                 x) << std::endl;

  std::cout << "(1-x-y)^2: " << viennamath::integrate( viennamath::make_interval(c0, c1),
                                                       viennamath::integrate( viennamath::make_interval(c0, c1 - x),
                                                                              (c1 - x - y) * (c1 - x - y),
                                                                              y),
                                                       x) << std::endl;
  std::cout << "x*y: " << viennamath::integrate( viennamath::make_interval(c0, c1),
                                                 viennamath::integrate( viennamath::make_interval(c0, c1 - x),
                                                                        x*y,
                                                                        y),
                                                 x) << std::endl;
  std::cout << "x*(1-x-y): " << viennamath::integrate( viennamath::make_interval(c0, c1),
                                                       viennamath::integrate( viennamath::make_interval(c0, c1 - x),
                                                                              x*(c1 - x - y),
                                                                              y),
                                                       x) << std::endl;
  std::cout << "y*(1-x-y): " << viennamath::integrate( viennamath::make_interval(c0, c1),
                                                       viennamath::integrate( viennamath::make_interval(c0, c1 - x),
                                                                              y*(c1 - x - y),
                                                                              y),
                                                       x) << std::endl;

  std::cout << "************************************************" << std::endl;
  std::cout << "*****     TEST COMPLETED SUCCESSFULLY!     *****" << std::endl;
  std::cout << "************************************************" << std::endl;

  return EXIT_SUCCESS;
}